

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
llvm::MemoryBuffer::getFileAsStream
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,Twine *Filename)

{
  bool bVar1;
  error_code eVar2;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  local_60;
  undefined1 local_41;
  undefined8 local_40;
  undefined1 local_38 [12];
  undefined4 uStack_2c;
  error_code EC;
  int FD;
  Twine *Filename_local;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *Ret;
  
  eVar2 = sys::fs::openFileForRead
                    (Filename,(int *)((long)&EC._M_cat + 4),F_None,(SmallVectorImpl<char> *)0x0);
  EC._0_8_ = eVar2._M_cat;
  local_38._8_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)(local_38 + 8));
  if (bVar1) {
    local_40 = CONCAT44(uStack_2c,local_38._8_4_);
    local_38._0_8_ = EC._0_8_;
    eVar2._4_4_ = 0;
    eVar2._M_value = local_38._8_4_;
    eVar2._M_cat = (error_category *)EC._0_8_;
    ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::ErrorOr
              (__return_storage_ptr__,eVar2);
  }
  else {
    local_41 = 0;
    getMemoryBufferForStream(&local_60,EC._M_cat._4_4_,Filename);
    ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                *)__return_storage_ptr__,&local_60,(type *)0x0);
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
    ::~ErrorOr(&local_60);
    close(EC._M_cat._4_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<std::unique_ptr<MemoryBuffer>>
MemoryBuffer::getFileAsStream(const Twine &Filename) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);
  if (EC)
    return EC;
  ErrorOr<std::unique_ptr<MemoryBuffer>> Ret =
      getMemoryBufferForStream(FD, Filename);
  close(FD);
  return Ret;
}